

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O0

bool __thiscall google::anon_unknown_0::LineReader::ReadLine(LineReader *this,char **bol,char **eol)

{
  bool bVar1;
  ssize_t sVar2;
  char *pcVar3;
  size_t __n;
  ssize_t num_bytes_1;
  size_t capacity_left;
  char *append_pos;
  size_t incomplete_line_length;
  ssize_t num_bytes;
  char **eol_local;
  char **bol_local;
  LineReader *this_local;
  
  bVar1 = BufferIsEmpty(this);
  if (bVar1) {
    sVar2 = ReadFromOffset(this->fd_,this->buf_,this->buf_len_,this->offset_);
    if (sVar2 < 1) {
      return false;
    }
    this->offset_ = sVar2 + this->offset_;
    this->eod_ = this->buf_ + sVar2;
    this->bol_ = this->buf_;
  }
  else {
    this->bol_ = this->eol_ + 1;
    if (this->eod_ < this->bol_) {
      abort();
    }
    bVar1 = HasCompleteLine(this);
    if (!bVar1) {
      __n = (long)this->eod_ - (long)this->bol_;
      memmove(this->buf_,this->bol_,__n);
      pcVar3 = this->buf_;
      sVar2 = ReadFromOffset(this->fd_,pcVar3 + __n,this->buf_len_ - __n,this->offset_);
      if (sVar2 < 1) {
        return false;
      }
      this->offset_ = sVar2 + this->offset_;
      this->eod_ = pcVar3 + __n + sVar2;
      this->bol_ = this->buf_;
    }
  }
  pcVar3 = FindLineFeed(this);
  this->eol_ = pcVar3;
  bVar1 = this->eol_ != (char *)0x0;
  if (bVar1) {
    *this->eol_ = '\0';
    *bol = this->bol_;
    *eol = this->eol_;
  }
  return bVar1;
}

Assistant:

bool ReadLine(const char** bol, const char** eol) {
    if (BufferIsEmpty()) {  // First time.
      const ssize_t num_bytes = ReadFromOffset(fd_, buf_, buf_len_, offset_);
      if (num_bytes <= 0) {  // EOF or error.
        return false;
      }
      offset_ += static_cast<size_t>(num_bytes);
      eod_ = buf_ + num_bytes;
      bol_ = buf_;
    } else {
      bol_ = eol_ + 1;  // Advance to the next line in the buffer.
      GLOG_SAFE_ASSERT(bol_ <= eod_);  // "bol_" can point to "eod_".
      if (!HasCompleteLine()) {
        const auto incomplete_line_length = static_cast<size_t>(eod_ - bol_);
        // Move the trailing incomplete line to the beginning.
        memmove(buf_, bol_, incomplete_line_length);
        // Read text from file and append it.
        char* const append_pos = buf_ + incomplete_line_length;
        const size_t capacity_left = buf_len_ - incomplete_line_length;
        const ssize_t num_bytes =
            ReadFromOffset(fd_, append_pos, capacity_left, offset_);
        if (num_bytes <= 0) {  // EOF or error.
          return false;
        }
        offset_ += static_cast<size_t>(num_bytes);
        eod_ = append_pos + num_bytes;
        bol_ = buf_;
      }
    }
    eol_ = FindLineFeed();
    if (eol_ == nullptr) {  // '\n' not found.  Malformed line.
      return false;
    }
    *eol_ = '\0';  // Replace '\n' with '\0'.

    *bol = bol_;
    *eol = eol_;
    return true;
  }